

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

int __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::init
          (programDefinition *this,EVP_PKEY_CTX *ctx)

{
  shaderDefinition *psVar1;
  shaderDefinition *psVar2;
  int in_EAX;
  int iVar3;
  GLuint GVar4;
  deUint32 err;
  int extraout_EAX;
  shaderDefinition *psVar5;
  InternalError *this_00;
  uint in_ECX;
  shaderDefinition *psVar6;
  long *in_RDX;
  char in_R8B;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar11 [16];
  
  this->m_gl = (Functions *)ctx;
  if (5 < in_ECX) {
    return in_EAX;
  }
  psVar5 = (shaderDefinition *)
           ((long)&switchD_00d6f8ab::switchdataD_01b72600 +
           (long)(int)(&switchD_00d6f8ab::switchdataD_01b72600)[in_ECX]);
  switch(in_ECX) {
  case 0:
    psVar5 = (shaderDefinition *)in_RDX[4];
    this->compute_shader = psVar5;
    if (psVar5 == (shaderDefinition *)0x0) {
      return 0;
    }
    break;
  case 1:
    psVar5 = (shaderDefinition *)in_RDX[5];
    this->fragment_shader = psVar5;
    psVar6 = (shaderDefinition *)in_RDX[3];
    this->vertex_shader = psVar6;
    if (psVar5 == (shaderDefinition *)0x0 || psVar6 == (shaderDefinition *)0x0) {
      return (int)CONCAT71((int7)((ulong)psVar5 >> 8),psVar5 != (shaderDefinition *)0x0);
    }
    break;
  case 2:
    psVar5 = (shaderDefinition *)*in_RDX;
    this->fragment_shader = psVar5;
    psVar6 = (shaderDefinition *)in_RDX[6];
    this->geometry_shader = psVar6;
    psVar1 = (shaderDefinition *)in_RDX[3];
    this->vertex_shader = psVar1;
    if ((psVar6 == (shaderDefinition *)0x0 || psVar5 == (shaderDefinition *)0x0) ||
        psVar1 == (shaderDefinition *)0x0) {
      return (int)CONCAT71((int7)((ulong)psVar5 >> 8),psVar1 != (shaderDefinition *)0x0);
    }
    break;
  case 3:
    iVar3 = (int)in_RDX[2];
    iVar7 = *(int *)((long)in_RDX + 0x14);
    iVar8 = (int)in_RDX[3];
    iVar9 = *(int *)((long)in_RDX + 0x1c);
    psVar6 = (shaderDefinition *)in_RDX[7];
    psVar1 = (shaderDefinition *)*in_RDX;
    *(int *)&this->tesselation_evaluation_shader = iVar3;
    *(int *)((long)&this->tesselation_evaluation_shader + 4) = iVar7;
    *(int *)&this->vertex_shader = iVar8;
    *(int *)((long)&this->vertex_shader + 4) = iVar9;
    this->fragment_shader = psVar1;
    this->tesselation_control_shader = psVar6;
    iVar10 = (int)psVar1;
    iVar12 = (int)((ulong)psVar1 >> 0x20);
    iVar13 = (int)psVar6;
    iVar14 = (int)((ulong)psVar6 >> 0x20);
    goto LAB_00d6f9cc;
  case 4:
    psVar5 = (shaderDefinition *)*in_RDX;
    this->fragment_shader = psVar5;
    if (in_R8B == '\0') {
      psVar6 = this->tesselation_control_shader;
    }
    else {
      psVar6 = (shaderDefinition *)in_RDX[1];
      this->tesselation_control_shader = psVar6;
    }
    psVar1 = (shaderDefinition *)in_RDX[8];
    this->tesselation_evaluation_shader = psVar1;
    psVar2 = (shaderDefinition *)in_RDX[3];
    this->vertex_shader = psVar2;
    iVar10 = (int)psVar5;
    iVar12 = (int)((ulong)psVar5 >> 0x20);
    iVar13 = (int)psVar6;
    iVar14 = (int)((ulong)psVar6 >> 0x20);
    iVar3 = (int)psVar1;
    iVar7 = (int)((ulong)psVar1 >> 0x20);
    iVar8 = (int)psVar2;
    iVar9 = (int)((ulong)psVar2 >> 0x20);
LAB_00d6f9cc:
    auVar11._0_4_ = -(uint)(iVar10 == 0 && iVar12 == 0);
    auVar11._4_4_ = -(uint)(iVar13 == 0 && iVar14 == 0);
    auVar11._8_4_ = -(uint)(iVar3 == 0 && iVar7 == 0);
    auVar11._12_4_ = -(uint)(iVar8 == 0 && iVar9 == 0);
    iVar3 = movmskps((int)psVar5,auVar11);
    if (iVar3 != 0) {
      return iVar3;
    }
    break;
  case 5:
    psVar5 = (shaderDefinition *)*in_RDX;
    this->fragment_shader = psVar5;
    psVar6 = (shaderDefinition *)in_RDX[9];
    this->vertex_shader = psVar6;
    if (psVar6 == (shaderDefinition *)0x0 || psVar5 == (shaderDefinition *)0x0) {
      return (int)CONCAT71((int7)((ulong)psVar5 >> 8),psVar5 != (shaderDefinition *)0x0);
    }
  }
  GVar4 = (**(code **)(ctx + 0x3c8))();
  this->m_program_object_id = GVar4;
  err = (**(code **)(ctx + 0x800))();
  glu::checkError(err,"Failed to create program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x1194);
  if (this->m_program_object_id != 0) {
    return extraout_EAX;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,"glCreateProgram return invalid id",fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
             ,0x1198);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArraySamplingTest::programDefinition::init(const glw::Functions& gl, const shaderGroup& shader_group,
															  shaderType shader_type, bool isContextES)
{
	m_gl = &gl;

	bool is_program_defined = false;

	switch (shader_type)
	{
	case Compute:
		compute_shader	 = shader_group.sampling_compute_shader;
		is_program_defined = (0 != compute_shader);
		break;
	case Fragment:
		fragment_shader	= shader_group.sampling_fragment_shader;
		vertex_shader	  = shader_group.pass_through_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != vertex_shader));
		break;
	case Geometry:
		fragment_shader	= shader_group.pass_through_fragment_shader;
		geometry_shader	= shader_group.sampling_geometry_shader;
		vertex_shader	  = shader_group.pass_through_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != geometry_shader) && (0 != vertex_shader));
		break;
	case Tesselation_Control:
		fragment_shader				  = shader_group.pass_through_fragment_shader;
		tesselation_control_shader	= shader_group.sampling_tesselation_control_shader;
		tesselation_evaluation_shader = shader_group.pass_through_tesselation_evaluation_shader;
		vertex_shader				  = shader_group.pass_through_vertex_shader;
		is_program_defined			  = ((0 != fragment_shader) && (0 != tesselation_control_shader) &&
							  (0 != tesselation_evaluation_shader) && (0 != vertex_shader));
		break;
	case Tesselation_Evaluation:
		fragment_shader = shader_group.pass_through_fragment_shader;
		if (isContextES)
		{
			tesselation_control_shader = shader_group.pass_through_tesselation_control_shader;
		}
		tesselation_evaluation_shader = shader_group.sampling_tesselation_evaluation_shader;
		vertex_shader				  = shader_group.pass_through_vertex_shader;
		is_program_defined			  = ((0 != fragment_shader) && (0 != tesselation_control_shader) &&
							  (0 != tesselation_evaluation_shader) && (0 != vertex_shader));
		break;
	case Vertex:
		fragment_shader	= shader_group.pass_through_fragment_shader;
		vertex_shader	  = shader_group.sampling_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != vertex_shader));
		break;
	}

	if (true == is_program_defined)
	{
		m_program_object_id = m_gl->createProgram();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program");

		if (m_invalid_program_object_id == m_program_object_id)
		{
			throw tcu::InternalError("glCreateProgram return invalid id", "", __FILE__, __LINE__);
		}
	}
}